

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups_edge
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle *sigma)

{
  float fVar1;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *pSVar2;
  uint uVar3;
  bool bVar4;
  Simplex_key SVar5;
  uint uVar6;
  Element x;
  int charac;
  pointer ppVar7;
  Filtration_value *pFVar8;
  mapped_type *pmVar9;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_138;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_130;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_120;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_118;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_110;
  int local_104;
  undefined1 local_100 [24];
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_e8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_e0;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_d8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_d0;
  int local_c4;
  undefined1 local_c0 [24];
  undefined1 local_a8 [16];
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_98;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_90;
  iterator map_it_v;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_80;
  iterator map_it_u;
  Simplex_key idx_coc_v;
  Simplex_key idx_coc_u;
  uint local_64;
  Simplex_key kv;
  uint local_54;
  tuples local_50 [4];
  Simplex_key ku;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_40;
  undefined1 local_38 [24];
  Simplex_handle v;
  Simplex_handle u;
  Simplex_handle *sigma_local;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator(&v);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)(local_38 + 0x10));
  pSVar2 = this->cpx_;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator(&local_40,sigma);
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::endpoints
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_38,
             (Simplex_handle *)pSVar2);
  boost::tuples::
  tie<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>
            (local_50,&v,
             (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
              *)(local_38 + 0x10));
  boost::tuples::
  tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_50,
              (pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>
               *)local_38);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)&stack0xffffffffffffffa0,&v);
  SVar5 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::key
                    ((Simplex_handle *)&stack0xffffffffffffffa0);
  local_54 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
             find_set<unsigned_int>(&this->dsets_,SVar5);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)&idx_coc_v,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)(local_38 + 0x10));
  SVar5 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::key
                    ((Simplex_handle *)&idx_coc_v);
  local_64 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
             find_set<unsigned_int>(&this->dsets_,SVar5);
  if (local_54 == local_64) {
    if (1 < this->dim_max_) {
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator(&local_138,sigma);
      x = Field_Zp::multiplicative_identity(&this->coeff_field_,0);
      charac = Field_Zp::characteristic(&this->coeff_field_);
      create_cocycle(this,&local_138,x,charac);
    }
  }
  else {
    boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
    link<unsigned_int>(&this->dsets_,local_54,local_64);
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->zero_cocycles_,&local_54);
    map_it_v = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end(&this->zero_cocycles_);
    bVar4 = std::__detail::operator==
                      (&local_80,
                       &map_it_v.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                      );
    if (bVar4) {
      map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _4_4_ = local_54;
    }
    else {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_80);
      map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _4_4_ = ppVar7->second;
    }
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->zero_cocycles_,&local_64);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->zero_cocycles_);
    bVar4 = std::__detail::operator==(&local_90,&local_98);
    if (bVar4) {
      map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _0_4_ = local_64;
    }
    else {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_90);
      map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _0_4_ = ppVar7->second;
    }
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
              ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)(local_a8 + 8),
               (Simplex_key)this->cpx_);
    pFVar8 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                       ((Simplex_handle *)(local_a8 + 8));
    fVar1 = *pFVar8;
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
              ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_a8,
               (Simplex_key)this->cpx_);
    pFVar8 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                       ((Simplex_handle *)local_a8);
    if (*pFVar8 <= fVar1) {
      Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
                ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)(local_100 + 0x10),
                 (Simplex_key)this->cpx_);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                      *)(local_100 + 8),sigma);
      bVar4 = length_interval::operator()
                        (&this->interval_length_policy,(Simplex_handle *)(local_100 + 0x10),
                         (Simplex_handle *)(local_100 + 8));
      if (bVar4) {
        Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
                  ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_100,
                   (Simplex_key)this->cpx_);
        local_104 = Field_Zp::characteristic(&this->coeff_field_);
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                    *)&this->persistent_pairs_,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)local_100,sigma,&local_104);
      }
      if (local_54 !=
          map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur._4_4_) {
        local_110._M_cur = local_80._M_cur;
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::erase(&this->zero_cocycles_,local_80._M_cur);
      }
      uVar3 = local_54;
      uVar6 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
              find_set<unsigned_int>(&this->dsets_,local_54);
      if (uVar3 == uVar6) {
        if (local_64 !=
            (uint)map_it_u.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur) {
          local_120._M_cur = local_90._M_cur;
          local_128._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::erase(&this->zero_cocycles_,local_90._M_cur);
        }
        uVar3 = (uint)map_it_u.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur;
        pmVar9 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->zero_cocycles_,&local_54);
        *pmVar9 = uVar3;
      }
    }
    else {
      Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
                ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)(local_c0 + 0x10),
                 (Simplex_key)this->cpx_);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                      *)(local_c0 + 8),sigma);
      bVar4 = length_interval::operator()
                        (&this->interval_length_policy,(Simplex_handle *)(local_c0 + 0x10),
                         (Simplex_handle *)(local_c0 + 8));
      if (bVar4) {
        Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
                  ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_c0,
                   (Simplex_key)this->cpx_);
        local_c4 = Field_Zp::characteristic(&this->coeff_field_);
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                    *)&this->persistent_pairs_,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)local_c0,sigma,&local_c4);
      }
      if (local_64 !=
          (uint)map_it_u.
                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
         ) {
        local_d0._M_cur = local_90._M_cur;
        local_d8._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::erase(&this->zero_cocycles_,local_90._M_cur);
      }
      uVar3 = local_64;
      uVar6 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
              find_set<unsigned_int>(&this->dsets_,local_64);
      if (uVar3 == uVar6) {
        if (local_54 !=
            map_it_u.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur._4_4_) {
          local_e0._M_cur = local_80._M_cur;
          local_e8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::erase(&this->zero_cocycles_,local_80._M_cur);
        }
        uVar3 = map_it_u.
                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
                ._4_4_;
        pmVar9 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->zero_cocycles_,&local_64);
        *pmVar9 = uVar3;
      }
    }
    pSVar2 = this->cpx_;
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_130,sigma);
    SVar5 = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::null_key();
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_key(pSVar2,&local_130,SVar5);
  }
  return;
}

Assistant:

void update_cohomology_groups_edge(Simplex_handle sigma) {
    Simplex_handle u, v;
    boost::tie(u, v) = cpx_->endpoints(sigma);

    Simplex_key ku = dsets_.find_set(cpx_->key(u));
    Simplex_key kv = dsets_.find_set(cpx_->key(v));

    if (ku != kv) {        // Destroy a connected component
      dsets_.link(ku, kv);
      // Keys of the simplices which created the connected components containing
      // respectively u and v.
      Simplex_key idx_coc_u, idx_coc_v;
      auto map_it_u = zero_cocycles_.find(ku);
      // If the index of the cocycle representing the class is already ku.
      if (map_it_u == zero_cocycles_.end()) {
        idx_coc_u = ku;
      } else {
        idx_coc_u = map_it_u->second;
      }

      auto map_it_v = zero_cocycles_.find(kv);
      // If the index of the cocycle representing the class is already kv.
      if (map_it_v == zero_cocycles_.end()) {
        idx_coc_v = kv;
      } else {
        idx_coc_v = map_it_v->second;
      }

      if (cpx_->filtration(cpx_->simplex(idx_coc_u))
          < cpx_->filtration(cpx_->simplex(idx_coc_v))) {  // Kill cocycle [idx_coc_v], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_v), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_v), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (kv != idx_coc_v) {
          zero_cocycles_.erase(map_it_v);
        }
        if (kv == dsets_.find_set(kv)) {
          if (ku != idx_coc_u) {
            zero_cocycles_.erase(map_it_u);
          }
          zero_cocycles_[kv] = idx_coc_u;
        }
      } else {  // Kill cocycle [idx_coc_u], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_u), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_u), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (ku != idx_coc_u) {
          zero_cocycles_.erase(map_it_u);
        }
        if (ku == dsets_.find_set(ku)) {
          if (kv != idx_coc_v) {
            zero_cocycles_.erase(map_it_v);
          }
          zero_cocycles_[ku] = idx_coc_v;
        }
      }
      cpx_->assign_key(sigma, cpx_->null_key());
    } else if (dim_max_ > 1) {  // If ku == kv, same connected component: create a 1-cocycle class.
      create_cocycle(sigma, coeff_field_.multiplicative_identity(), coeff_field_.characteristic());
    }
  }